

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O0

void csr2dense(CUPDLPdense *dense,CUPDLPcsr *csr)

{
  cupdlp_int iMatElem;
  cupdlp_int iCol;
  cupdlp_int iRow;
  CUPDLPcsr *csr_local;
  CUPDLPdense *dense_local;
  
  dense->nRows = csr->nRows;
  dense->nCols = csr->nCols;
  iMatElem = 0;
  for (iRow = 0; iRow < dense->nRows; iRow = iRow + 1) {
    for (iCol = 0; iCol < dense->nCols; iCol = iCol + 1) {
      if (iCol == csr->rowMatIdx[iMatElem]) {
        dense->data[iRow * dense->nCols + iCol] = csr->rowMatElem[iMatElem];
        iMatElem = iMatElem + 1;
      }
      else {
        dense->data[iRow * dense->nCols + iCol] = 0.0;
      }
    }
  }
  return;
}

Assistant:

void csr2dense(CUPDLPdense *dense, CUPDLPcsr *csr) {
  dense->nRows = csr->nRows;
  dense->nCols = csr->nCols;

  cupdlp_int iRow = 0;
  cupdlp_int iCol = 0;
  cupdlp_int iMatElem = 0;
  for (iRow = 0; iRow < dense->nRows; ++iRow)
    for (iCol = 0; iCol < dense->nCols; ++iCol) {
      if (iCol == csr->rowMatIdx[iMatElem]) {
        dense->data[iRow * dense->nCols + iCol] = csr->rowMatElem[iMatElem];
        ++iMatElem;
      } else {
        dense->data[iRow * dense->nCols + iCol] = 0;
      }
    }

  return;
}